

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetSimpleJitExecutedIterations
          (FunctionExecutionStateMachine *this)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode executionMode;
  undefined4 *puVar5;
  FunctionEntryPointInfo *pFVar6;
  char *this_00;
  
  this_00 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x136,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar4) goto LAB_0077fdcb;
    *puVar5 = 0;
  }
  executionMode = StateToMode((FunctionExecutionStateMachine *)this_00,this->executionState);
  VerifyExecutionMode(this,executionMode);
  if (executionMode != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x137,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar4) goto LAB_0077fdcb;
    *puVar5 = 0;
  }
  pFVar6 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  if (pFVar6 == (FunctionEntryPointInfo *)0x0) {
    return 0;
  }
  uVar2 = pFVar6->callsCount;
  uVar1 = this->simpleJitLimit;
  if (uVar1 == 0) {
    if (uVar2 == 0) {
      return 0;
    }
  }
  else if (uVar2 < uVar1) {
    if (uVar2 == 0) {
      return uVar1;
    }
    goto LAB_0077fdb6;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                              ,0x141,
                              "(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount)",
                              "simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount");
  if (!bVar4) {
LAB_0077fdcb:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar5 = 0;
  uVar1 = this->simpleJitLimit;
LAB_0077fdb6:
  return uVar1 + ~(ushort)uVar2;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetSimpleJitExecutedIterations() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);

        FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
        if (!simpleJitEntryPointInfo)
        {
            return 0;
        }

        // Simple JIT counts down and transitions on overflow
        const uint32 callCount = simpleJitEntryPointInfo->callsCount;
        Assert(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount);
        return callCount == 0 ?
            static_cast<uint16>(simpleJitLimit) :
            static_cast<uint16>(simpleJitLimit) - static_cast<uint16>(callCount) - 1;
    }